

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

CookieInfo * Curl_cookie_init(SessionHandle *data,char *file,CookieInfo *inc,_Bool newsession)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  
  if (inc == (CookieInfo *)0x0) {
    inc = (CookieInfo *)(*Curl_ccalloc)(1,0x28);
    if (inc == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    pcVar3 = "none";
    if (file != (char *)0x0) {
      pcVar3 = file;
    }
    pcVar3 = (*Curl_cstrdup)(pcVar3);
    inc->filename = pcVar3;
  }
  inc->running = false;
  if (file == (char *)0x0) {
LAB_004eeef8:
    inc->newsession = newsession;
  }
  else {
    iVar1 = curl_strequal(file,"-");
    __stream = _stdin;
    if (iVar1 == 0) {
      if (*file == '\0') goto LAB_004eeef8;
      __stream = fopen64(file,"r");
    }
    inc->newsession = newsession;
    if (__stream != (FILE *)0x0) {
      pcVar3 = (char *)(*Curl_cmalloc)(5000);
      if (pcVar3 != (char *)0x0) {
        while (pcVar4 = fgets(pcVar3,5000,__stream), pcVar4 != (char *)0x0) {
          iVar2 = Curl_raw_nequal("Set-Cookie:",pcVar3,0xb);
          pcVar4 = pcVar3;
          if (iVar2 != 0) {
            pcVar4 = pcVar3 + 0xb;
          }
          for (; (*pcVar4 == ' ' || (*pcVar4 == '\t')); pcVar4 = pcVar4 + 1) {
          }
          Curl_cookie_add(data,inc,iVar2 != 0,pcVar4,(char *)0x0,(char *)0x0);
        }
        (*Curl_cfree)(pcVar3);
      }
      if (iVar1 == 0) {
        fclose(__stream);
      }
    }
  }
  inc->running = true;
  return inc;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct SessionHandle *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp;
  bool fromfile=TRUE;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && strequal(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, "r"):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    char *line = malloc(MAX_COOKIE_LINE);
    if(line) {
      while(fgets(line, MAX_COOKIE_LINE, fp)) {
        if(checkprefix("Set-Cookie:", line)) {
          /* This is a cookie line, get it! */
          lineptr=&line[11];
          headerline=TRUE;
        }
        else {
          lineptr=line;
          headerline=FALSE;
        }
        while(*lineptr && ISBLANK(*lineptr))
          lineptr++;

        Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
      }
      free(line); /* free the line buffer */
    }
    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;
}